

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDAnalyzerResults.cpp
# Opt level: O0

void __thiscall
SWDAnalyzerResults::GetBubbleText
          (SWDAnalyzerResults *this,Frame *f,DisplayBase display_base,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *results)

{
  U32 val;
  byte bVar1;
  ulong uVar2;
  char *local_b58;
  string local_958 [32];
  string local_938 [32];
  string local_918 [8];
  string msg;
  allocator local_8f1;
  string local_8f0 [39];
  allocator local_8c9;
  string local_8c8 [39];
  allocator local_8a1;
  string local_8a0 [39];
  allocator local_879;
  string local_878 [39];
  allocator local_851;
  string local_850 [39];
  allocator local_829;
  string local_828 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808 [32];
  value_type local_7e8 [39];
  allocator local_7c1;
  string local_7c0 [32];
  string local_7a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760 [32];
  string local_740 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0 [32];
  string local_6a0 [8];
  string reg_value;
  string local_680 [8];
  string reg_name_1;
  string local_658 [4];
  SWDRegisters reg;
  string data_str;
  allocator local_631;
  string local_630 [39];
  allocator local_609;
  string local_608 [39];
  allocator local_5e1;
  string local_5e0 [39];
  allocator local_5b9;
  string local_5b8 [39];
  allocator local_591;
  string local_590 [39];
  allocator local_569;
  string local_568 [39];
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [39];
  allocator local_4f1;
  string local_4f0 [39];
  allocator local_4c9;
  string local_4c8 [39];
  allocator local_4a1;
  string local_4a0 [39];
  allocator local_479;
  string local_478 [39];
  allocator local_451;
  string local_450 [39];
  allocator local_429;
  string local_428 [39];
  allocator local_401;
  string local_400 [39];
  allocator local_3d9;
  string local_3d8 [39];
  allocator local_3b1;
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350 [39];
  allocator local_329;
  string local_328 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8 [39];
  allocator local_281;
  string local_280 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200 [39];
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [32];
  value_type local_168 [39];
  allocator local_141;
  string local_140 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [32];
  undefined1 local_a0 [8];
  string reg_name;
  string local_70 [8];
  string addr_str;
  SWDRequestFrame *req;
  string result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *results_local;
  DisplayBase display_base_local;
  Frame *f_local;
  SWDAnalyzerResults *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(results);
  std::__cxx11::string::string((string *)&req);
  if (f[0x20] == (Frame)0x3) {
    bVar1 = SWDRequestFrame::GetAddr((SWDRequestFrame *)f);
    int2str_sal_abi_cxx11_((U64)local_70,(uint)bVar1,display_base);
    SWDRequestFrame::GetRegisterName_abi_cxx11_((SWDRequestFrame *)local_a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_140,"Request ",&local_141);
    SWDRequestFrame::IsAccessPort((SWDRequestFrame *)f);
    std::operator+(local_120,(char *)local_140);
    SWDRequestFrame::IsRead((SWDRequestFrame *)f);
    std::operator+(local_100,(char *)local_120);
    std::operator+(local_e0,(char *)local_100);
    std::operator+(local_c0,local_e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,local_c0);
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string((string *)local_e0);
    std::__cxx11::string::~string((string *)local_100);
    std::__cxx11::string::~string((string *)local_120);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    int2str_sal_abi_cxx11_((U64)local_168,(DisplayBase)*(undefined8 *)(f + 0x18),display_base);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,local_168);
    std::__cxx11::string::~string((string *)local_168);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_188,"rq",&local_189);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_188);
    std::__cxx11::string::~string(local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b0,"req",&local_1b1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_1b0);
    std::__cxx11::string::~string(local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d8,"request",&local_1d9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_1d8);
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_280,"request ",&local_281);
    SWDRequestFrame::IsAccessPort((SWDRequestFrame *)f);
    std::operator+(local_260,(char *)local_280);
    SWDRequestFrame::IsRead((SWDRequestFrame *)f);
    std::operator+(local_240,(char *)local_260);
    std::operator+(local_220,(char *)local_240);
    std::operator+(local_200,local_220);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,local_200);
    std::__cxx11::string::~string((string *)local_200);
    std::__cxx11::string::~string((string *)local_220);
    std::__cxx11::string::~string((string *)local_240);
    std::__cxx11::string::~string((string *)local_260);
    std::__cxx11::string::~string(local_280);
    std::allocator<char>::~allocator((allocator<char> *)&local_281);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_328,"Request ",&local_329);
    SWDRequestFrame::IsAccessPort((SWDRequestFrame *)f);
    std::operator+(local_308,(char *)local_328);
    SWDRequestFrame::IsRead((SWDRequestFrame *)f);
    std::operator+(local_2e8,(char *)local_308);
    std::operator+(local_2c8,(char *)local_2e8);
    std::operator+(local_2a8,local_2c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,local_2a8);
    std::__cxx11::string::~string((string *)local_2a8);
    std::__cxx11::string::~string((string *)local_2c8);
    std::__cxx11::string::~string((string *)local_2e8);
    std::__cxx11::string::~string((string *)local_308);
    std::__cxx11::string::~string(local_328);
    std::allocator<char>::~allocator((allocator<char> *)&local_329);
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string(local_70);
  }
  else if (f[0x20] == (Frame)0x2) {
    int2str_abi_cxx11_((U64)local_390);
    std::operator+((char *)local_370,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Line Reset ");
    std::operator+(local_350,(char *)local_370);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,local_350);
    std::__cxx11::string::~string((string *)local_350);
    std::__cxx11::string::~string(local_370);
    std::__cxx11::string::~string(local_390);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3b0,"rst",&local_3b1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_3b0);
    std::__cxx11::string::~string(local_3b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3d8,"reset",&local_3d9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_3d8);
    std::__cxx11::string::~string(local_3d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_400,"Line Reset",&local_401);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_400);
    std::__cxx11::string::~string(local_400);
    std::allocator<char>::~allocator((allocator<char> *)&local_401);
  }
  else if (f[0x20] == (Frame)0x4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_428,"Turnaround",&local_429);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_428);
    std::__cxx11::string::~string(local_428);
    std::allocator<char>::~allocator((allocator<char> *)&local_429);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_450,"T",&local_451);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_450);
    std::__cxx11::string::~string(local_450);
    std::allocator<char>::~allocator((allocator<char> *)&local_451);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_478,"trn",&local_479);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_478);
    std::__cxx11::string::~string(local_478);
    std::allocator<char>::~allocator((allocator<char> *)&local_479);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4a0,"turn",&local_4a1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_4a0);
    std::__cxx11::string::~string(local_4a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  }
  else if (f[0x20] == (Frame)0x5) {
    if (*(long *)(f + 0x10) == 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4c8,"ACK OK",&local_4c9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(results,(value_type *)local_4c8);
      std::__cxx11::string::~string(local_4c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4f0,"OK",&local_4f1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(results,(value_type *)local_4f0);
      std::__cxx11::string::~string(local_4f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
    }
    else if (*(long *)(f + 0x10) == 2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_518,"ACK WAIT",&local_519);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(results,(value_type *)local_518);
      std::__cxx11::string::~string(local_518);
      std::allocator<char>::~allocator((allocator<char> *)&local_519);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_540,"WAIT",&local_541);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(results,(value_type *)local_540);
      std::__cxx11::string::~string(local_540);
      std::allocator<char>::~allocator((allocator<char> *)&local_541);
    }
    else if (*(long *)(f + 0x10) == 4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_568,"ACK FAULT",&local_569);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(results,(value_type *)local_568);
      std::__cxx11::string::~string(local_568);
      std::allocator<char>::~allocator((allocator<char> *)&local_569);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_590,"FAULT",&local_591);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(results,(value_type *)local_590);
      std::__cxx11::string::~string(local_590);
      std::allocator<char>::~allocator((allocator<char> *)&local_591);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5b8,"ACK <unknown> probably disconnected",&local_5b9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(results,(value_type *)local_5b8);
      std::__cxx11::string::~string(local_5b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5e0,"ACK <unknown>",&local_5e1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(results,(value_type *)local_5e0);
      std::__cxx11::string::~string(local_5e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_608,"disc",&local_609);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(results,(value_type *)local_608);
      std::__cxx11::string::~string(local_608);
      std::allocator<char>::~allocator((allocator<char> *)&local_609);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_630,"ACK",&local_631);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_630);
    std::__cxx11::string::~string(local_630);
    std::allocator<char>::~allocator((allocator<char> *)&local_631);
  }
  else if (f[0x20] == (Frame)0x6) {
    int2str_sal_abi_cxx11_((U64)local_658,(DisplayBase)*(undefined8 *)(f + 0x10),display_base);
    val = *(U32 *)(f + 0x18);
    GetRegisterName_abi_cxx11_((SWDRegisters)local_680);
    GetRegisterValueDesc_abi_cxx11_((SWDRegisters)local_6a0,val,*(DisplayBase *)(f + 0x10));
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::operator+((char *)local_740,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"WData ");
      std::operator+(local_720,(char *)local_740);
      std::operator+(local_700,local_720);
      std::operator+(local_6e0,(char *)local_700);
      std::operator+(local_6c0,local_6e0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(results,local_6c0);
      std::__cxx11::string::~string((string *)local_6c0);
      std::__cxx11::string::~string((string *)local_6e0);
      std::__cxx11::string::~string((string *)local_700);
      std::__cxx11::string::~string((string *)local_720);
      std::__cxx11::string::~string(local_740);
    }
    std::operator+((char *)local_7a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"WData ");
    std::operator+(local_780,(char *)local_7a0);
    std::operator+(local_760,local_780);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,local_760);
    std::__cxx11::string::~string((string *)local_760);
    std::__cxx11::string::~string((string *)local_780);
    std::__cxx11::string::~string(local_7a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_7c0,"WData",&local_7c1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_7c0);
    std::__cxx11::string::~string(local_7c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
    std::operator+((char *)local_7e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"WData ");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,local_7e8);
    std::__cxx11::string::~string((string *)local_7e8);
    std::__cxx11::string::~string(local_6a0);
    std::__cxx11::string::~string(local_680);
    std::__cxx11::string::~string(local_658);
  }
  else if (f[0x20] == (Frame)0x7) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_828,"Data parity",&local_829);
    std::operator+(local_808,(char *)local_828);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,local_808);
    std::__cxx11::string::~string((string *)local_808);
    std::__cxx11::string::~string(local_828);
    std::allocator<char>::~allocator((allocator<char> *)&local_829);
    if (*(long *)(f + 0x10) == 0) {
      local_b58 = "BD0";
    }
    else {
      local_b58 = "BD1";
    }
    local_b58 = local_b58 + 2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_850,local_b58,&local_851);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_850);
    std::__cxx11::string::~string(local_850);
    std::allocator<char>::~allocator((allocator<char> *)&local_851);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_878,"prty",&local_879);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_878);
    std::__cxx11::string::~string(local_878);
    std::allocator<char>::~allocator((allocator<char> *)&local_879);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8a0,"Parity",&local_8a1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_8a0);
    std::__cxx11::string::~string(local_8a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_8a1);
  }
  else if (f[0x20] == (Frame)0x8) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8c8,"Trailing bits",&local_8c9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_8c8);
    std::__cxx11::string::~string(local_8c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8f0,"Trail",&local_8f1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_8f0);
    std::__cxx11::string::~string(local_8f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_8f1);
  }
  else {
    std::__cxx11::string::string(local_918);
    switch(f[0x20]) {
    case (Frame)0x0:
      std::__cxx11::string::operator=(local_918,"err");
      break;
    case (Frame)0x1:
      int2str_abi_cxx11_((U64)local_958);
      std::operator+((char *)local_938,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"bit ");
      std::__cxx11::string::operator=(local_918,local_938);
      std::__cxx11::string::~string(local_938);
      std::__cxx11::string::~string(local_958);
      break;
    case (Frame)0x3:
      std::__cxx11::string::operator=(local_918,"request");
      break;
    case (Frame)0x6:
      std::__cxx11::string::operator=(local_918,"data");
      break;
    case (Frame)0x7:
      std::__cxx11::string::operator=(local_918,"dprty");
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_918);
    std::__cxx11::string::~string(local_918);
  }
  std::__cxx11::string::~string((string *)&req);
  return;
}

Assistant:

void SWDAnalyzerResults::GetBubbleText( const Frame& f, DisplayBase display_base, std::vector<std::string>& results )
{
    results.clear();

    std::string result;

    if( f.mType == SWDFT_Request )
    {
        SWDRequestFrame& req( ( SWDRequestFrame& )f );

        std::string addr_str( int2str_sal( req.GetAddr(), display_base, 4 ) );
        std::string reg_name( req.GetRegisterName() );

        results.push_back( std::string( "Request " ) + ( req.IsAccessPort() ? " AccessPort" : " DebugPort" ) +
                           ( req.IsRead() ? " Read" : " Write" ) + " " + reg_name );

        results.push_back( int2str_sal( req.mData2, display_base ) );
        results.push_back( "rq" );
        results.push_back( "req" );
        results.push_back( "request" );
        results.push_back( std::string( "request " ) + ( req.IsAccessPort() ? "AP" : "DP" ) + ( req.IsRead() ? " R" : " W" ) + " " +
                           reg_name );

        results.push_back( std::string( "Request " ) + ( req.IsAccessPort() ? "AccessPort" : "DebugPort" ) +
                           ( req.IsRead() ? " Read" : " Write" ) + " " + reg_name );
    }
    else if( f.mType == SWDFT_LineReset )
    {
        results.push_back( "Line Reset " + int2str( f.mData1 ) + " bits" );
        results.push_back( "rst" );
        results.push_back( "reset" );
        results.push_back( "Line Reset" );
    }
    else if( f.mType == SWDFT_Turnaround )
    {
        results.push_back( "Turnaround" );
        results.push_back( "T" );
        results.push_back( "trn" );
        results.push_back( "turn" );
    }
    else if( f.mType == SWDFT_ACK )
    {
        if( f.mData1 == ACK_OK )
        {
            results.push_back( "ACK OK" );
            results.push_back( "OK" );
        }
        else if( f.mData1 == ACK_WAIT )
        {
            results.push_back( "ACK WAIT" );
            results.push_back( "WAIT" );
        }
        else if( f.mData1 == ACK_FAULT )
        {
            results.push_back( "ACK FAULT" );
            results.push_back( "FAULT" );
        }
        else
        {
            results.push_back( "ACK <unknown> probably disconnected" );
            results.push_back( "ACK <unknown>" );
            results.push_back( "disc" );
        }

        results.push_back( "ACK" );
    }
    else if( f.mType == SWDFT_WData )
    {
        std::string data_str( int2str_sal( f.mData1, display_base, 32 ) );
        SWDRegisters reg( SWDRegisters( f.mData2 ) );
        std::string reg_name( GetRegisterName( reg ) );
        std::string reg_value( GetRegisterValueDesc( reg, U32( f.mData1 ), display_base ) );

        if( !reg_value.empty() )
            results.push_back( "WData " + data_str + " reg " + reg_name + " bits " + reg_value );
        results.push_back( "WData " + data_str + " reg " + reg_name );
        results.push_back( "WData" );
        results.push_back( "WData " + data_str );
    }
    else if( f.mType == SWDFT_DataParity )
    {
        results.push_back( std::string( "Data parity" ) + ( f.mData2 ? "ok" : "NOT OK" ) );
        results.push_back( f.mData1 ? "1" : "0" );
        results.push_back( "prty" );
        results.push_back( "Parity" );
    }
    else if( f.mType == SWDFT_TrailingBits )
    {
        results.push_back( "Trailing bits" );
        results.push_back( "Trail" );
    }
    else
    {
        std::string msg;

        switch( f.mType )
        {
        case SWDFT_Bit:
            msg = "bit " + int2str( f.mData2 );
            break;
        case SWDFT_WData:
            msg = "data";
            break;
        case SWDFT_DataParity:
            msg = "dprty";
            break;
        case SWDFT_Error:
            msg = "err";
            break;
        case SWDFT_Request:
            msg = "request";
            break;
        }

        results.push_back( msg );
    }
}